

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O2

void __thiscall MxxSort_SampleSortInbalanced_Test::TestBody(MxxSort_SampleSortInbalanced_Test *this)

{
  pointer ppVar1;
  int iVar2;
  int iVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  pointer ppVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  MPI_Datatype poVar9;
  pointer ppVar10;
  unsigned_long uVar11;
  pointer ppVar12;
  ulong uVar13;
  pointer ppVar14;
  ulong uVar15;
  ulong uVar16;
  pointer ppVar17;
  pointer puVar18;
  pair<int,_int> pVar19;
  long lVar20;
  unsigned_long *puVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  size_t i_2;
  size_type __new_size;
  long lVar25;
  pointer ppVar26;
  size_t i;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  comm *in_R8;
  size_t i_1;
  comm *comm;
  char *pcVar30;
  pointer in_R9;
  size_t bucket_size;
  size_type sVar31;
  ulong uVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  allocator_type local_129;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> recv_elements;
  comm c;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> allsorted;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> vec;
  datatype dt;
  size_t local_size;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> truth;
  
  mxx::comm::comm(&c);
  srand(c.m_rank * 0xd);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&vec,(long)c.m_rank * 3 + 10,(allocator_type *)&send_counts);
  ppVar5 = vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar17 = vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVar17 != ppVar5; ppVar17 = ppVar17 + 1)
  {
    iVar7 = rand();
    iVar8 = rand();
    ppVar17->first = iVar7;
    ppVar17->second = iVar8;
  }
  mxx::gatherv<std::pair<int,int>>
            (&truth,(mxx *)&vec,
             (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0,(int)&c,in_R8
            );
  if (c.m_rank == 0) {
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_SampleSortInbalanced_Test::TestBody()::__1>
              (truth.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               truth.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  ppVar17 = vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppVar5 = vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  poVar9 = mxx::datatype_builder<std::pair<int,_int>_>::get_type();
  iVar7 = c.m_size;
  dt._vptr_datatype = (_func_int **)&PTR__datatype_001aad50;
  dt.builtin = false;
  uVar33 = (ulong)c.m_size;
  dt.mpitype = poVar9;
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_SampleSortInbalanced_Test::TestBody()::__1>
            (ppVar5,ppVar17);
  if (iVar7 != 1) {
    ppVar10 = (pointer)((long)ppVar17 - (long)ppVar5 >> 3);
    local_size = (size_t)ppVar10;
    uVar11 = mxx::allreduce<unsigned_long,std::plus<unsigned_long>>(&local_size,&c);
    comm = (comm *)local_size;
    bVar6 = mxx::all_of(local_size ==
                        uVar11 / uVar33 + (ulong)((ulong)(long)c.m_rank < uVar11 % uVar33),&c);
    iVar7 = iVar7 + -1;
    allsorted.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    allsorted.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    allsorted.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar31 = (size_type)iVar7;
    if (bVar6) {
      if (ppVar17 == ppVar5) {
        mxx::assert_fail("local_size > 0",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                         ,0xa9,"sample_block_decomp");
      }
      iVar8 = c.m_size;
      lVar25 = (long)c.m_size;
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&recv_counts,
                 sVar31,(allocator_type *)&send_counts);
      ppVar12 = ppVar5;
      for (uVar27 = 0;
          (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 != uVar27; uVar27 = uVar27 + 1) {
        ppVar12 = ppVar12 + (ulong)ppVar10 / uVar33 + (ulong)(uVar27 < (ulong)ppVar10 % uVar33);
        *(pair<int,_int> *)
         (recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start + uVar27) = ppVar12[-1];
      }
      if (c.m_rank == 0) {
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &send_counts,(long)(iVar8 * iVar7),(allocator_type *)&recv_elements);
        MPI_Gather(recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,iVar7,poVar9,
                   send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,iVar7,poVar9,0,c.mpi_comm);
        std::
        sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_SampleSortInbalanced_Test::TestBody()::__1>
                  (send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        lVar20 = lVar25 + -1;
        if ((long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3 != lVar20) {
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     &recv_counts,lVar25 - 1);
          lVar20 = (long)recv_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)recv_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
        }
        puVar21 = send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start + (sVar31 - 1);
        for (lVar25 = 0; lVar20 != lVar25; lVar25 = lVar25 + 1) {
          recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar25] = *puVar21;
          puVar21 = puVar21 + sVar31;
        }
        std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                  ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &send_counts);
      }
      else {
        MPI_Gather(recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,iVar7,poVar9,0,0,poVar9,0,c.mpi_comm);
        if ((long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3 != lVar25 + -1) {
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     &recv_counts,(long)(iVar8 + -1));
        }
      }
      MPI_Bcast(recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start,
                (ulong)((long)recv_counts.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)recv_counts.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3,poVar9,0,c.mpi_comm);
    }
    else {
      recv_elements.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = ppVar10;
      uVar11 = mxx::allreduce<unsigned_long,std::plus<unsigned_long>>(&recv_elements,&c);
      iVar7 = c.m_size;
      lVar25 = (long)c.m_size;
      if (recv_elements.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        uVar33 = (uVar11 + (long)recv_elements.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start * lVar25 * sVar31) - 1;
        __new_size = 1;
        if (uVar11 <= uVar33) {
          __new_size = uVar33 / uVar11;
        }
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &recv_counts,__new_size);
        ppVar12 = ppVar5;
        for (comm = (comm *)0x0;
            (comm *)((long)recv_counts.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)recv_counts.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3) != comm;
            comm = (comm *)((long)&comm->_vptr_comm + 1)) {
          ppVar12 = ppVar12 + (ulong)recv_elements.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start / (__new_size + 1) +
                              (ulong)(comm < (comm *)((ulong)recv_elements.
                                                                                                                          
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start %
                                                  (__new_size + 1)));
          *(pair<int,_int> *)
           (recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start + (long)comm) = ppVar12[-1];
        }
      }
      mxx::gatherv<std::pair<int,int>>
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&send_counts,
                 (mxx *)&recv_counts,
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0,(int)&c,
                 comm);
      if (c.m_rank == 0) {
        std::
        sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_SampleSortInbalanced_Test::TestBody()::__1>
                  (send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        uVar33 = (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        lVar20 = lVar25 + -1;
        if ((long)uVar33 >> 3 != lVar20) {
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     &recv_counts,(long)(iVar7 + -1));
          uVar33 = (long)recv_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)recv_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
          lVar20 = (long)uVar33 >> 3;
        }
        puVar21 = send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start + (sVar31 - 1);
        for (lVar23 = 0; lVar20 != lVar23; lVar23 = lVar23 + 1) {
          recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar23] = *puVar21;
          puVar21 = puVar21 + sVar31;
        }
      }
      else {
        uVar33 = (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        lVar20 = (long)uVar33 >> 3;
      }
      if (lVar20 != lVar25 + -1) {
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &recv_counts,lVar25 - 1);
        uVar33 = (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      }
      MPI_Bcast(recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start,uVar33 >> 3,poVar9,0,c.mpi_comm);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &send_counts);
    }
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_move_assign
              (&allsorted,
               (_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               &recv_counts);
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               &recv_counts);
    send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar31 = (size_type)c.m_size;
    if ((long)allsorted.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)allsorted.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start >> 3 != sVar31 - 1) {
      mxx::assert_fail("splitters.size() == (size_t)comm.size() - 1",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                       ,0xe9,"split");
      sVar31 = (size_type)c.m_size;
    }
    recv_elements.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&recv_counts,sVar31,(value_type_conflict2 *)&recv_elements,&local_129);
    uVar29 = (ulong)c.m_size;
    uVar27 = (long)allsorted.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)allsorted.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    in_R9 = ppVar5;
    uVar33 = 0;
    while (uVar33 < uVar27) {
      iVar7 = allsorted.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start[uVar33].first;
      uVar24 = 1;
      uVar22 = 2;
      while( true ) {
        uVar32 = ((int)uVar22 - 1) + uVar33;
        if (((uVar27 <= uVar32) ||
            (iVar7 < allsorted.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar32].first)) ||
           ((iVar7 == allsorted.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar32].first &&
            (allsorted.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start[uVar33].second <
             allsorted.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start[uVar32].second)))) break;
        uVar22 = (ulong)((int)uVar22 + 1);
        uVar24 = uVar24 + 1;
      }
      iVar8 = allsorted.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start[uVar33].second;
      ppVar12 = in_R9;
      uVar28 = (long)ppVar17 - (long)in_R9 >> 3;
      do {
        while( true ) {
          uVar13 = uVar28;
          ppVar14 = ppVar12;
          ppVar26 = ppVar12;
          if ((long)uVar13 < 1) goto LAB_00161cac;
          uVar28 = uVar13 >> 1;
          ppVar26 = ppVar12 + uVar28;
          iVar2 = ppVar26->first;
          bVar35 = SBORROW4(iVar2,iVar7);
          iVar3 = iVar2 - iVar7;
          bVar34 = iVar2 == iVar7;
          if (iVar7 <= iVar2) break;
LAB_00161c0f:
          ppVar12 = ppVar26 + 1;
          uVar28 = ~uVar28 + uVar13;
        }
        if (bVar34) {
          iVar2 = ppVar26->second;
          bVar35 = SBORROW4(iVar2,iVar8);
          iVar3 = iVar2 - iVar8;
          bVar34 = iVar2 == iVar8;
          if (iVar2 < iVar8) goto LAB_00161c0f;
        }
      } while (!bVar34 && bVar35 == iVar3 < 0);
      while (uVar16 = uVar28, 0 < (long)uVar16) {
        uVar28 = uVar16 >> 1;
        ppVar1 = ppVar14 + uVar28;
        if ((ppVar1->first < iVar7) || ((ppVar1->first == iVar7 && (ppVar1->second < iVar8)))) {
          uVar28 = ~uVar28 + uVar16;
          ppVar14 = ppVar1 + 1;
        }
      }
      ppVar26 = ppVar26 + 1;
      uVar28 = (long)((long)ppVar12 + (uVar13 * 8 - (long)ppVar26)) >> 3;
      while (uVar13 = uVar28, 0 < (long)uVar13) {
        uVar28 = uVar13 >> 1;
        if ((ppVar26[uVar28].first <= iVar7) &&
           ((iVar7 != ppVar26[uVar28].first || (ppVar26[uVar28].second <= iVar8)))) {
          ppVar26 = ppVar26 + uVar28 + 1;
          uVar28 = ~uVar28 + uVar13;
        }
      }
LAB_00161cac:
      puVar18 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start + uVar33;
      uVar11 = ((long)ppVar14 - (long)in_R9 >> 3) + *puVar18;
      *puVar18 = uVar11;
      uVar28 = (long)ppVar26 - (long)ppVar14 >> 3;
      uVar22 = (uVar11 + uVar28) / uVar22 + 1;
      lVar25 = uVar33 << 0x20;
      for (uVar33 = 0; uVar24 != uVar33; uVar33 = uVar33 + 1) {
        uVar13 = puVar18[uVar33];
        uVar15 = (ulong)ppVar10 / uVar29 +
                 (ulong)((ulong)(lVar25 >> 0x20) < (ulong)ppVar10 % uVar29);
        uVar16 = uVar15 - uVar13;
        if (uVar15 < uVar13 || uVar16 == 0) {
          uVar16 = 0;
        }
        else {
          if (uVar16 <= uVar22) {
            uVar16 = uVar22;
          }
          if (uVar28 < uVar16) {
            uVar16 = uVar28;
          }
          uVar28 = uVar28 - uVar16;
        }
        puVar18[uVar33] = uVar16 + uVar13;
        lVar25 = lVar25 + 0x100000000;
      }
      recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar32] =
           recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar32] + uVar28;
      in_R9 = ppVar26;
      uVar33 = uVar32;
    }
    recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar29 - 1] =
         recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[uVar29 - 1] + ((long)ppVar17 - (long)in_R9 >> 3);
    ppVar17 = (pointer)0x0;
    for (puVar18 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        puVar18 !=
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish; puVar18 = puVar18 + 1) {
      ppVar17 = (pointer)((long)&ppVar17->first + *puVar18);
    }
    if (ppVar17 != ppVar10) {
      mxx::assert_fail("std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                       ,0x114,"split");
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&send_counts,
               &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    mxx::all2all<unsigned_long>(&recv_counts,&send_counts,&c);
    uVar33 = 0;
    for (puVar18 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        puVar18 !=
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish; puVar18 = puVar18 + 1) {
      uVar33 = uVar33 + *puVar18;
    }
    if ((2 < local_size && bVar6) && (local_size * 2 < uVar33)) {
      mxx::assert_fail("!_AssumeBlockDecomp || (local_size <= 2 || recv_n <= 2* local_size)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                       ,0x193,"samplesort");
    }
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (&recv_elements,uVar33,(allocator_type *)&local_129);
    in_R8 = &c;
    mxx::all2allv<std::pair<int,int>>
              (ppVar5,&send_counts,
               recv_elements.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,&recv_counts,in_R8);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_SampleSortInbalanced_Test::TestBody()::__1>
              (recv_elements.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               recv_elements.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    if (bVar6) {
      mxx::
      stable_distribute<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )recv_elements.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )recv_elements.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )ppVar5,&c);
    }
    else {
      in_R8 = &c;
      mxx::
      redo_arbit_decomposition<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )recv_elements.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )recv_elements.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )ppVar5,local_size,in_R8);
    }
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&recv_elements.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&allsorted.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  }
  mxx::datatype::~datatype(&dt);
  mxx::gatherv<std::pair<int,int>>
            (&allsorted,(mxx *)&vec,
             (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0,(int)&c,in_R8
            );
  bVar6 = std::
          is_sorted<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_SampleSortInbalanced_Test::TestBody()::__1>
                    (vec.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     vec.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(recv_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,bVar6);
  recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar6) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
    bVar6 = std::
            is_sorted<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_SampleSortInbalanced_Test::TestBody()::__1>
                      (vec.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       vec.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (c.m_size != 1) {
      mxx::comm::comm((comm *)&send_counts);
      pVar19 = mxx::right_shift<std::pair<int,int>>
                         (vec.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1,(comm *)&send_counts);
      mxx::comm::~comm((comm *)&send_counts);
      if (bVar6 && c.m_rank >= 1) {
        if ((vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->first < pVar19.first) {
          bVar6 = false;
        }
        else {
          bVar6 = true;
          if ((vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->first == pVar19.first) {
            bVar6 = pVar19.second <=
                    (vec.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->second;
          }
        }
      }
      else {
        bVar6 = bVar6 && c.m_rank < 1;
      }
      bVar6 = mxx::all_of(bVar6,&c);
    }
    recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(recv_counts.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,bVar6);
    recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (bVar6 == false) {
      testing::Message::Message((Message *)&recv_elements);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&send_counts,(internal *)&recv_counts,
                 (AssertionResult *)"mxx::is_sorted(vec.begin(), vec.end(), paircmp, c)","false",
                 "true",(char *)in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&dt,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
                 ,0x50,(char *)send_counts.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      testing::internal::AssertHelper::operator=((AssertHelper *)&dt,(Message *)&recv_elements);
      goto LAB_00162260;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
    if (c.m_rank != 0) goto LAB_00162289;
    recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)truth.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)truth.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
    recv_elements.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)allsorted.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)allsorted.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&send_counts,"truth.size()","allsorted.size()",
               (unsigned_long *)&recv_counts,(unsigned_long *)&recv_elements);
    if ((char)send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != '\0') {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
      lVar25 = 4;
      for (uVar33 = 0;
          uVar33 < (ulong)((long)truth.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)truth.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar33 = uVar33 + 1) {
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&send_counts,"truth[i].first","allsorted[i].first",
                   (int *)((long)truth.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar25 + -4),
                   (int *)((long)allsorted.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar25 + -4));
        if ((char)send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&recv_counts);
          pcVar30 = "";
          if (send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            pcVar30 = (char *)*send_counts.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&recv_elements,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
                     ,0x56,pcVar30);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&recv_elements,(Message *)&recv_counts);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&recv_elements);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&recv_counts);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&send_counts.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&send_counts,"truth[i].second","allsorted[i].second",
                   (int *)((long)&(truth.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first + lVar25),
                   (int *)((long)&(allsorted.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first + lVar25));
        if ((char)send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&recv_counts);
          pcVar30 = "";
          if (send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            pcVar30 = (char *)*send_counts.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&recv_elements,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
                     ,0x57,pcVar30);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&recv_elements,(Message *)&recv_counts);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&recv_elements);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&recv_counts);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&send_counts.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish);
        lVar25 = lVar25 + 8;
      }
      goto LAB_00162289;
    }
    testing::Message::Message((Message *)&recv_counts);
    if (send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar30 = "";
    }
    else {
      pcVar30 = (char *)*send_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&recv_elements,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
               ,0x54,pcVar30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&recv_elements,(Message *)&recv_counts);
    pvVar4 = &send_counts;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&recv_elements);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&recv_counts);
  }
  else {
    testing::Message::Message((Message *)&recv_elements);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&send_counts,(internal *)&recv_counts,
               (AssertionResult *)"std::is_sorted(vec.begin(), vec.end(), paircmp)","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&dt,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
               ,0x4e,(char *)send_counts.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&dt,(Message *)&recv_elements);
LAB_00162260:
    pvVar4 = &recv_counts;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&dt);
    std::__cxx11::string::~string((string *)&send_counts);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&recv_elements);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&(pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish);
LAB_00162289:
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&allsorted.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&truth.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(MxxSort, SampleSortInbalanced) {
    mxx::comm c;
    srand(c.rank()*13);
    std::vector<std::pair<int,int> > vec(10 + c.rank()*3);

    std::generate(vec.begin(), vec.end(), [](){return std::make_pair(std::rand(), std::rand());});

    // comparator for sorting
    auto paircmp = [](const std::pair<int,int>& x, const std::pair<int, int>& y){
        return x.first < y.first || (x.first == y.first && x.second < y.second);
    };

    // send all elements to master and sort there as "groud-truth"
    std::vector<std::pair<int, int>> truth = mxx::gatherv(vec, 0, c);
    if (c.rank() == 0)
        std::sort(truth.begin(), truth.end(), paircmp);

    // distributed sort
    mxx::sort(vec.begin(), vec.end(), paircmp, c);

    // send to rank 0
    std::vector<std::pair<int,int>> allsorted = mxx::gatherv(vec, 0, c);

    // should be sorted locally
    ASSERT_TRUE(std::is_sorted(vec.begin(), vec.end(), paircmp));
    // should be sorted globally
    ASSERT_TRUE(mxx::is_sorted(vec.begin(), vec.end(), paircmp, c));

    // on rank 0, vectors should be the same
    if (c.rank() == 0) {
        ASSERT_EQ(truth.size(), allsorted.size());
        for (size_t i = 0; i < truth.size(); ++i) {
            EXPECT_EQ(truth[i].first, allsorted[i].first);
            EXPECT_EQ(truth[i].second, allsorted[i].second);
        }
    }
}